

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TableGetColumnIsVisible(int column_n)

{
  ImGuiTable *pIVar1;
  ImGuiTable *table;
  ImGuiContext *g;
  int column_n_local;
  bool local_1;
  
  pIVar1 = GImGui->CurrentTable;
  if (pIVar1 == (ImGuiTable *)0x0) {
    local_1 = false;
  }
  else {
    column_n_local = column_n;
    if (column_n < 0) {
      column_n_local = pIVar1->CurrentColumn;
    }
    local_1 = (pIVar1->VisibleUnclippedMaskByIndex & 1L << ((byte)column_n_local & 0x3f)) != 0;
  }
  return local_1;
}

Assistant:

bool    ImGui::TableGetColumnIsVisible(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return false;
    if (column_n < 0)
        column_n = table->CurrentColumn;
    return (table->VisibleUnclippedMaskByIndex & ((ImU64)1 << column_n)) != 0;
}